

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatementReader.cpp
# Opt level: O3

void __thiscall
Js::
StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
::Create(StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
         *this,FunctionBody *functionRead,uint startOffset,bool useOriginalByteCode)

{
  byte bVar1;
  SmallSpanSequence *statementMap;
  Utf8SourceInfo *pUVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  ByteBlock *this_00;
  List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *fullstatementMap;
  byte *byteCodeStart;
  
  if (functionRead == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/StatementReader.cpp"
                                ,0x57,"(functionRead != nullptr)",
                                "Must provide valid function to execute");
    if (!bVar4) goto LAB_008a4963;
    *puVar5 = 0;
  }
  if (useOriginalByteCode) {
    this_00 = FunctionBody::GetOriginalByteCode(functionRead);
  }
  else {
    this_00 = FunctionBody::GetByteCode(functionRead);
  }
  if (this_00 == (ByteBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/StatementReader.cpp"
                                ,0x5d,"(pblkByteCode != nullptr)",
                                "Must have valid byte-code to read");
    if (!bVar4) {
LAB_008a4963:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  statementMap = (functionRead->m_sourceInfo).pSpanSequence;
  if ((statementMap == (SmallSpanSequence *)0x0) &&
     (pUVar2 = (functionRead->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr,
     bVar1 = pUVar2->field_0xa8,
     (byte)((bVar1 & 0x40) >> 6 & (bVar1 >> 5 | (pUVar2->debugModeSource).ptr != (uchar *)0x0)) == 1
     )) {
    fullstatementMap =
         (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)FunctionProxy::GetAuxPtrWithLock((FunctionProxy *)functionRead,StatementMaps);
  }
  else {
    fullstatementMap =
         (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)0x0;
  }
  byteCodeStart = ByteBlock::GetBuffer(this_00);
  Create(this,byteCodeStart,startOffset,statementMap,fullstatementMap);
  return;
}

Assistant:

void StatementReader<FunctionBody::StatementMapList>::Create(FunctionBody* functionRead, uint startOffset, bool useOriginalByteCode)
    {
        AssertMsg(functionRead != nullptr, "Must provide valid function to execute");

        ByteBlock * pblkByteCode = useOriginalByteCode ?
            functionRead->GetOriginalByteCode() :
            functionRead->GetByteCode();

        AssertMsg(pblkByteCode != nullptr, "Must have valid byte-code to read");

        SmallSpanSequence* statementMap = functionRead->GetStatementMapSpanSequence();
        FunctionBody::StatementMapList* fullMap = nullptr;
        if (statementMap == nullptr && functionRead->IsInDebugMode())
        {
            fullMap = functionRead->GetStatementMaps();
        }
        Create(pblkByteCode->GetBuffer(), startOffset, statementMap, fullMap);
    }